

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O1

int __thiscall ncnn::Gemm_x86::create_pipeline_int8(Gemm_x86 *this,Option *opt)

{
  undefined8 uVar1;
  void *pvVar2;
  int *piVar3;
  Allocator *pAVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  undefined1 *puVar13;
  long lVar14;
  undefined1 *puVar15;
  ulong uVar16;
  undefined8 *puVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  undefined1 (*pauVar33) [16];
  long lVar34;
  ulong uVar35;
  long lVar36;
  undefined1 (*pauVar37) [16];
  int iVar38;
  long lVar39;
  long lVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  int TILE_M;
  ulong local_198;
  long local_190;
  Gemm_x86 *local_188;
  long local_180;
  long local_178;
  ulong local_170;
  undefined8 local_168;
  undefined8 local_160;
  ulong local_158;
  int TILE_N;
  Option *local_148;
  long local_140;
  long local_138;
  ulong local_130;
  uint local_128;
  int TILE_K;
  Mat *local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  uint local_100;
  uint local_fc;
  int local_f8;
  uint local_f4;
  long local_f0;
  ulong local_e8;
  ulong local_e0;
  int TILE_M_1;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  size_t local_c8;
  int local_c0;
  Allocator *local_b8;
  undefined1 local_b0 [16];
  int local_a0;
  size_t local_98;
  ulong local_88;
  ulong local_80;
  long local_78;
  long local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  local_188 = this;
  local_148 = opt;
  if ((this->super_Gemm).constantA == 0) {
LAB_004b74b1:
    if ((this->super_Gemm).constantB != 0) {
      uVar7 = (this->super_Gemm).constantN;
      uVar28 = (this->super_Gemm).constantK;
      get_optimal_tile_mnk_int8
                (0,uVar7,uVar28,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M_1,
                 &TILE_M,&TILE_N,local_148->num_threads);
      local_128 = (int)(uVar7 + TILE_M + -1) / TILE_M;
      local_88 = (ulong)uVar7;
      Mat::create(&this->BT_data,TILE_M * TILE_N,(int)(TILE_N + uVar28 + -1) / TILE_N,local_128,1,
                  (Allocator *)0x0);
      if ((this->BT_data).data == (void *)0x0) {
        bVar41 = true;
      }
      else {
        bVar41 = (long)(this->BT_data).c * (this->BT_data).cstep == 0;
      }
      if (bVar41) goto LAB_004b7584;
      if (0 < (int)local_128) {
        local_118 = 0;
        do {
          if (0 < (int)uVar28) {
            local_f8 = TILE_M * (int)local_118;
            local_fc = (int)local_88 - local_f8;
            lVar8 = (long)local_f8;
            local_68 = lVar8 + 7;
            local_70 = lVar8 + 6;
            local_78 = lVar8 + 5;
            local_80 = lVar8 + 4;
            local_e0 = lVar8 + 3;
            local_e8 = lVar8 + 2;
            local_f0 = lVar8 + 1;
            iVar18 = 0;
            do {
              uVar7 = local_fc;
              if (TILE_M < (int)local_fc) {
                uVar7 = TILE_M;
              }
              uVar30 = uVar28 - iVar18;
              lVar9 = (long)TILE_N;
              uVar29 = uVar30;
              if (TILE_N < (int)uVar30) {
                uVar29 = TILE_N;
              }
              sVar5 = (this->BT_data).elemsize;
              pauVar37 = (undefined1 (*) [16])
                         ((long)(this->BT_data).data +
                         (long)(this->BT_data).w * sVar5 * (long)(iVar18 / TILE_N) +
                         (long)(local_f8 / TILE_M) * (this->BT_data).cstep * sVar5);
              if ((this->super_Gemm).transB == 0) {
                iVar38 = (this->super_Gemm).B_data.w;
                lVar9 = (long)iVar38;
                uVar16 = 0;
                if (7 < (int)uVar7) {
                  lVar34 = lVar8 + lVar9;
                  lVar39 = lVar8;
                  uVar23 = 0;
                  do {
                    pvVar2 = (this->super_Gemm).B_data.data;
                    lVar21 = (long)(this->super_Gemm).B_data.w * (long)iVar18 *
                             (this->super_Gemm).B_data.elemsize;
                    if ((int)uVar29 < 2) {
                      lVar31 = (long)pvVar2 + lVar8 + uVar23;
                      uVar30 = 0;
                    }
                    else {
                      lVar31 = (long)pvVar2 + lVar39;
                      lVar32 = (long)pvVar2 + lVar34;
                      iVar20 = 1;
                      do {
                        uVar16 = *(ulong *)(lVar31 + lVar21);
                        uVar1 = *(undefined8 *)(lVar32 + lVar21);
                        auVar49._8_6_ = 0;
                        auVar49._0_8_ = uVar16;
                        auVar49[0xe] = (char)(uVar16 >> 0x38);
                        auVar49[0xf] = (char)((ulong)uVar1 >> 0x38);
                        auVar48._14_2_ = auVar49._14_2_;
                        auVar48._8_5_ = 0;
                        auVar48._0_8_ = uVar16;
                        auVar48[0xd] = (char)((ulong)uVar1 >> 0x30);
                        auVar47._13_3_ = auVar48._13_3_;
                        auVar47._8_4_ = 0;
                        auVar47._0_8_ = uVar16;
                        auVar47[0xc] = (char)(uVar16 >> 0x30);
                        auVar46._12_4_ = auVar47._12_4_;
                        auVar46._8_3_ = 0;
                        auVar46._0_8_ = uVar16;
                        auVar46[0xb] = (char)((ulong)uVar1 >> 0x28);
                        auVar45._11_5_ = auVar46._11_5_;
                        auVar45._8_2_ = 0;
                        auVar45._0_8_ = uVar16;
                        auVar45[10] = (char)(uVar16 >> 0x28);
                        auVar44._10_6_ = auVar45._10_6_;
                        auVar44[8] = 0;
                        auVar44._0_8_ = uVar16;
                        auVar44[9] = (char)((ulong)uVar1 >> 0x20);
                        auVar43._9_7_ = auVar44._9_7_;
                        auVar43[8] = (char)(uVar16 >> 0x20);
                        auVar43._0_8_ = uVar16;
                        auVar42._8_8_ = auVar43._8_8_;
                        auVar42[7] = (char)((ulong)uVar1 >> 0x18);
                        auVar42[6] = (char)(uVar16 >> 0x18);
                        auVar42[5] = (char)((ulong)uVar1 >> 0x10);
                        auVar42[4] = (char)(uVar16 >> 0x10);
                        auVar42[3] = (char)((ulong)uVar1 >> 8);
                        auVar42[2] = (char)(uVar16 >> 8);
                        auVar42[0] = (undefined1)uVar16;
                        auVar42[1] = (char)uVar1;
                        *pauVar37 = auVar42;
                        pauVar37 = pauVar37 + 1;
                        lVar31 = lVar31 + iVar38 * 2;
                        lVar32 = lVar32 + iVar38 * 2;
                        iVar20 = iVar20 + 2;
                        uVar30 = uVar29 & 0xfffffffe;
                      } while (iVar20 < (int)uVar29);
                    }
                    puVar17 = (undefined8 *)(lVar31 + lVar21);
                    iVar20 = uVar29 - uVar30;
                    if (iVar20 != 0 && (int)uVar30 <= (int)uVar29) {
                      do {
                        *(undefined8 *)*pauVar37 = *puVar17;
                        pauVar37 = (undefined1 (*) [16])(*pauVar37 + 8);
                        puVar17 = (undefined8 *)((long)puVar17 + lVar9);
                        iVar20 = iVar20 + -1;
                      } while (iVar20 != 0);
                    }
                    uVar16 = uVar23 + 8;
                    uVar27 = uVar23 + 0xf;
                    lVar39 = lVar39 + 8;
                    lVar34 = lVar34 + 8;
                    uVar23 = uVar16;
                  } while (uVar27 < uVar7);
                }
                if ((int)((uint)uVar16 | 3) < (int)uVar7) {
                  local_178 = (long)iVar18;
                  lVar31 = (long)(iVar38 * 2);
                  local_160 = CONCAT44(local_160._4_4_,uVar29) & 0xfffffffffffffffe;
                  local_198 = (ulong)(int)uVar7;
                  lVar34 = lVar8 + (uVar16 & 0xffffffff);
                  uVar27 = (iVar38 + 3) + lVar34;
                  lVar32 = (iVar38 + 2) + lVar34;
                  lVar21 = (iVar38 + 1) + lVar34;
                  lVar39 = lVar34 + lVar9;
                  uVar23 = uVar16 & 0xffffffff;
                  do {
                    pvVar2 = (local_188->super_Gemm).B_data.data;
                    lVar19 = (local_188->super_Gemm).B_data.w * local_178 *
                             (local_188->super_Gemm).B_data.elemsize;
                    if ((int)uVar29 < 2) {
                      lVar36 = (long)pvVar2 + lVar8 + uVar23;
                      uVar30 = 0;
                    }
                    else {
                      lVar36 = (long)pvVar2 + lVar34;
                      lVar14 = uVar27 + (long)pvVar2;
                      lVar40 = (long)pvVar2 + lVar32;
                      lVar26 = (long)pvVar2 + lVar21;
                      lVar22 = (long)pvVar2 + lVar39;
                      iVar20 = 1;
                      do {
                        (*pauVar37)[0] = *(undefined1 *)(lVar36 + lVar19);
                        (*pauVar37)[1] = *(undefined1 *)(lVar22 + lVar19);
                        (*pauVar37)[2] = *(undefined1 *)(lVar36 + 1 + lVar19);
                        (*pauVar37)[3] = *(undefined1 *)(lVar26 + lVar19);
                        (*pauVar37)[4] = *(undefined1 *)(lVar36 + 2 + lVar19);
                        (*pauVar37)[5] = *(undefined1 *)(lVar40 + lVar19);
                        (*pauVar37)[6] = *(undefined1 *)(lVar36 + 3 + lVar19);
                        (*pauVar37)[7] = *(undefined1 *)(lVar14 + lVar19);
                        pauVar37 = (undefined1 (*) [16])(*pauVar37 + 8);
                        iVar20 = iVar20 + 2;
                        lVar36 = lVar36 + lVar31;
                        lVar14 = lVar14 + lVar31;
                        lVar40 = lVar40 + lVar31;
                        lVar26 = lVar26 + lVar31;
                        lVar22 = lVar22 + lVar31;
                      } while (iVar20 < (int)uVar29);
                      uVar30 = uVar29 & 0xfffffffe;
                      local_190 = lVar32;
                      local_158 = uVar27;
                    }
                    iVar20 = uVar29 - uVar30;
                    if (iVar20 != 0 && (int)uVar30 <= (int)uVar29) {
                      puVar13 = (undefined1 *)(lVar36 + lVar19 + 3);
                      do {
                        (*pauVar37)[0] = puVar13[-3];
                        (*pauVar37)[1] = puVar13[-2];
                        (*pauVar37)[2] = puVar13[-1];
                        (*pauVar37)[3] = *puVar13;
                        pauVar37 = (undefined1 (*) [16])(*pauVar37 + 4);
                        puVar13 = puVar13 + lVar9;
                        iVar20 = iVar20 + -1;
                      } while (iVar20 != 0);
                    }
                    uVar16 = uVar23 + 4;
                    lVar19 = uVar23 + 7;
                    lVar34 = lVar34 + 4;
                    uVar27 = uVar27 + 4;
                    lVar32 = lVar32 + 4;
                    lVar21 = lVar21 + 4;
                    lVar39 = lVar39 + 4;
                    uVar23 = uVar16;
                    this = local_188;
                  } while (lVar19 < (long)local_198);
                }
                if ((int)((uint)uVar16 | 1) < (int)uVar7) {
                  lVar31 = (long)(iVar38 * 2);
                  local_190 = (long)(int)uVar7;
                  lVar34 = lVar8 + (uVar16 & 0xffffffff);
                  lVar21 = (iVar38 + 1) + lVar34;
                  lVar39 = lVar34 + lVar9;
                  uVar23 = uVar16 & 0xffffffff;
                  do {
                    pvVar2 = (this->super_Gemm).B_data.data;
                    lVar32 = (long)(this->super_Gemm).B_data.w * (long)iVar18 *
                             (this->super_Gemm).B_data.elemsize;
                    if ((int)uVar29 < 2) {
                      lVar19 = (long)pvVar2 + lVar8 + uVar23;
                      uVar30 = 0;
                    }
                    else {
                      lVar19 = (long)pvVar2 + lVar34;
                      lVar36 = (long)pvVar2 + lVar21;
                      lVar40 = (long)pvVar2 + lVar39;
                      iVar38 = 1;
                      do {
                        (*pauVar37)[0] = *(undefined1 *)(lVar19 + lVar32);
                        (*pauVar37)[1] = *(undefined1 *)(lVar40 + lVar32);
                        (*pauVar37)[2] = *(undefined1 *)(lVar19 + 1 + lVar32);
                        (*pauVar37)[3] = *(undefined1 *)(lVar36 + lVar32);
                        pauVar37 = (undefined1 (*) [16])(*pauVar37 + 4);
                        iVar38 = iVar38 + 2;
                        lVar19 = lVar19 + lVar31;
                        lVar36 = lVar36 + lVar31;
                        lVar40 = lVar40 + lVar31;
                      } while (iVar38 < (int)uVar29);
                      uVar30 = uVar29 & 0xfffffffe;
                      this = local_188;
                    }
                    iVar38 = uVar29 - uVar30;
                    if (iVar38 != 0 && (int)uVar30 <= (int)uVar29) {
                      puVar13 = (undefined1 *)(lVar19 + lVar32 + 1);
                      do {
                        (*pauVar37)[0] = puVar13[-1];
                        (*pauVar37)[1] = *puVar13;
                        pauVar37 = (undefined1 (*) [16])(*pauVar37 + 2);
                        puVar13 = puVar13 + lVar9;
                        iVar38 = iVar38 + -1;
                      } while (iVar38 != 0);
                    }
                    uVar16 = uVar23 + 2;
                    lVar32 = uVar23 + 3;
                    lVar34 = lVar34 + 2;
                    lVar21 = lVar21 + 2;
                    lVar39 = lVar39 + 2;
                    uVar23 = uVar16;
                  } while (lVar32 < local_190);
                }
                if ((int)uVar16 < (int)uVar7) {
                  lVar34 = (long)(int)uVar16;
                  do {
                    if (0 < (int)uVar29) {
                      puVar13 = (undefined1 *)
                                ((long)(this->super_Gemm).B_data.data +
                                lVar8 + lVar34 +
                                (long)(this->super_Gemm).B_data.w * (long)iVar18 *
                                (this->super_Gemm).B_data.elemsize);
                      uVar30 = uVar29;
                      do {
                        (*pauVar37)[0] = *puVar13;
                        pauVar37 = (undefined1 (*) [16])(*pauVar37 + 1);
                        puVar13 = puVar13 + lVar9;
                        uVar30 = uVar30 - 1;
                      } while (uVar30 != 0);
                    }
                    lVar34 = lVar34 + 1;
                  } while (lVar34 != (int)uVar7);
                }
              }
              else {
                uVar16 = 0;
                lVar34 = (long)iVar18;
                if (7 < (int)uVar7) {
                  local_f4 = uVar29 & 0xfffffffe;
                  local_130 = (ulong)uVar7;
                  uVar23 = local_80;
                  lVar39 = local_78;
                  lVar21 = lVar8;
                  lVar31 = local_f0;
                  uVar27 = local_e0;
                  uVar35 = local_e8;
                  uVar16 = 0;
                  uVar11 = local_68;
                  local_120 = (Mat *)local_70;
                  do {
                    local_160 = uVar11;
                    local_198 = uVar16;
                    local_190 = lVar21;
                    local_178 = lVar39;
                    local_158 = uVar23;
                    lVar39 = (long)(this->super_Gemm).B_data.w;
                    sVar5 = (this->super_Gemm).B_data.elemsize;
                    lVar21 = (long)(this->super_Gemm).B_data.data + lVar34;
                    if ((int)uVar29 < 2) {
                      lVar39 = sVar5 * lVar39;
                      lVar32 = (local_198 + lVar8) * lVar39 + lVar21;
                      lVar36 = (local_198 + lVar8 + 1) * lVar39 + lVar21;
                      local_180 = (local_198 + lVar8 + 2) * lVar39 + lVar21;
                      lVar19 = (local_198 + lVar8 + 3) * lVar39 + lVar21;
                      local_168 = (local_198 + lVar8 + 4) * lVar39 + lVar21;
                      local_140 = (local_198 + lVar8 + 5) * lVar39 + lVar21;
                      local_170 = (local_198 + lVar8 + 6) * lVar39 + lVar21;
                      lVar40 = (local_198 + lVar8 + 7) * lVar39 + lVar21;
                      uVar10 = 0;
                    }
                    else {
                      lVar40 = sVar5 * local_160 * lVar39;
                      lVar19 = lVar21 + lVar40;
                      lVar24 = sVar5 * (long)local_120 * lVar39;
                      lVar36 = lVar21 + lVar24;
                      local_140 = sVar5 * local_178 * lVar39;
                      lVar25 = local_140 + lVar21;
                      lVar14 = sVar5 * local_158 * lVar39;
                      lVar22 = lVar14 + lVar21;
                      local_40 = sVar5 * uVar27 * lVar39;
                      local_180 = sVar5 * uVar35 * lVar39;
                      lVar26 = lVar21 + local_180;
                      local_38 = sVar5 * lVar31 * lVar39;
                      local_50 = sVar5 * local_190 * lVar39;
                      lVar39 = 0;
                      pauVar33 = pauVar37;
                      do {
                        pauVar12 = pauVar33;
                        pauVar33 = (undefined1 (*) [16])(pauVar37[1] + lVar39 * 8);
                        pauVar33[-1][0] = *(undefined1 *)(local_50 + lVar21 + lVar39);
                        pauVar33[-1][1] = *(undefined1 *)(local_50 + lVar21 + 1 + lVar39);
                        pauVar33[-1][2] = *(undefined1 *)(local_38 + lVar21 + lVar39);
                        pauVar33[-1][3] = *(undefined1 *)(local_38 + lVar21 + 1 + lVar39);
                        pauVar33[-1][4] = *(undefined1 *)(lVar26 + lVar39);
                        pauVar33[-1][5] = *(undefined1 *)(lVar26 + 1 + lVar39);
                        pauVar33[-1][6] = *(undefined1 *)(lVar21 + local_40 + lVar39);
                        pauVar33[-1][7] = *(undefined1 *)(lVar21 + local_40 + 1 + lVar39);
                        pauVar33[-1][8] = *(undefined1 *)(lVar22 + lVar39);
                        pauVar33[-1][9] = *(undefined1 *)(lVar22 + 1 + lVar39);
                        pauVar33[-1][10] = *(undefined1 *)(lVar25 + lVar39);
                        pauVar33[-1][0xb] = *(undefined1 *)(lVar25 + 1 + lVar39);
                        pauVar33[-1][0xc] = *(undefined1 *)(lVar36 + lVar39);
                        pauVar33[-1][0xd] = *(undefined1 *)(lVar36 + 1 + lVar39);
                        pauVar33[-1][0xe] = *(undefined1 *)(lVar19 + lVar39);
                        pauVar33[-1][0xf] = *(undefined1 *)(lVar19 + 1 + lVar39);
                        lVar32 = lVar39 + 2;
                        iVar38 = (int)lVar39;
                        lVar39 = lVar32;
                      } while (iVar38 + 3 < (int)uVar29);
                      pauVar37 = pauVar12 + 1;
                      lVar32 = lVar21 + lVar32;
                      lVar40 = lVar40 + lVar32;
                      local_170 = lVar24 + lVar32;
                      local_140 = local_140 + lVar32;
                      local_168 = lVar14 + lVar32;
                      lVar19 = local_40 + lVar32;
                      local_180 = local_180 + lVar32;
                      lVar36 = local_38 + lVar32;
                      lVar32 = lVar32 + local_50;
                      this = local_188;
                      uVar10 = local_f4;
                      local_138 = lVar31;
                      local_110 = uVar27;
                      local_108 = uVar35;
                      local_48 = lVar21;
                    }
                    if ((int)uVar10 < (int)uVar29) {
                      lVar39 = 0;
                      do {
                        (*pauVar37)[0] = *(undefined1 *)(lVar32 + lVar39);
                        (*pauVar37)[1] = *(undefined1 *)(lVar36 + lVar39);
                        (*pauVar37)[2] = *(undefined1 *)(local_180 + lVar39);
                        (*pauVar37)[3] = *(undefined1 *)(lVar19 + lVar39);
                        (*pauVar37)[4] = *(undefined1 *)(local_168 + lVar39);
                        (*pauVar37)[5] = *(undefined1 *)(local_140 + lVar39);
                        (*pauVar37)[6] = *(undefined1 *)(local_170 + lVar39);
                        (*pauVar37)[7] = *(undefined1 *)(lVar40 + lVar39);
                        pauVar37 = (undefined1 (*) [16])(*pauVar37 + 8);
                        lVar39 = lVar39 + 1;
                        this = local_188;
                      } while (uVar29 - uVar10 != (int)lVar39);
                    }
                    uVar16 = local_198 + 8;
                    local_120 = (Mat *)((long)local_120 + 8);
                    uVar27 = uVar27 + 8;
                    uVar35 = uVar35 + 8;
                    lVar31 = lVar31 + 8;
                    uVar23 = local_158 + 8;
                    lVar39 = local_178 + 8;
                    lVar21 = local_190 + 8;
                    uVar11 = local_160 + 8;
                  } while (local_198 + 0xf < local_130);
                }
                lVar39 = (long)(int)uVar7;
                if ((int)((uint)uVar16 | 3) < (int)uVar7) {
                  local_168 = CONCAT44(local_168._4_4_,uVar29) & 0xfffffffffffffffe;
                  uVar16 = uVar16 & 0xffffffff;
                  lVar21 = local_e0 + uVar16;
                  uVar23 = local_e8 + uVar16;
                  uVar27 = lVar8 + uVar16;
                  lVar31 = local_f0 + uVar16;
                  do {
                    local_158 = uVar16;
                    local_190 = lVar31;
                    lVar31 = (long)(this->super_Gemm).B_data.w;
                    sVar5 = (this->super_Gemm).B_data.elemsize;
                    pvVar2 = (this->super_Gemm).B_data.data;
                    if ((int)uVar29 < 2) {
                      lVar31 = sVar5 * lVar31;
                      lVar32 = (local_158 + lVar8) * lVar31 + lVar34;
                      lVar19 = (local_158 + lVar8 + 1) * lVar31 + lVar34;
                      lVar36 = (local_158 + lVar8 + 2) * lVar31 + lVar34;
                      lVar40 = (local_158 + lVar8 + 3) * lVar31 + lVar34;
                      iVar38 = 0;
                    }
                    else {
                      lVar40 = sVar5 * lVar21 * lVar31;
                      lVar26 = lVar40 + lVar34;
                      lVar36 = sVar5 * uVar23 * lVar31;
                      lVar14 = lVar36 + lVar34;
                      lVar19 = sVar5 * local_190 * lVar31;
                      lVar22 = lVar19 + lVar34;
                      lVar31 = sVar5 * uVar27 * lVar31;
                      lVar24 = lVar31 + lVar34;
                      pauVar33 = pauVar37;
                      lVar25 = 0;
                      do {
                        pauVar12 = pauVar33;
                        pauVar33 = (undefined1 (*) [16])(*pauVar37 + lVar25 * 4 + 8);
                        pauVar33[-1][8] = *(undefined1 *)((long)pvVar2 + lVar25 + lVar24);
                        pauVar33[-1][9] = *(undefined1 *)((long)pvVar2 + lVar25 + lVar24 + 1);
                        pauVar33[-1][10] = *(undefined1 *)((long)pvVar2 + lVar25 + lVar22);
                        pauVar33[-1][0xb] = *(undefined1 *)((long)pvVar2 + lVar25 + lVar22 + 1);
                        pauVar33[-1][0xc] = *(undefined1 *)((long)pvVar2 + lVar25 + lVar14);
                        pauVar33[-1][0xd] = *(undefined1 *)((long)pvVar2 + lVar25 + lVar14 + 1);
                        pauVar33[-1][0xe] = *(undefined1 *)((long)pvVar2 + lVar25 + lVar26);
                        pauVar33[-1][0xf] = *(undefined1 *)((long)pvVar2 + lVar25 + lVar26 + 1);
                        lVar32 = lVar25 + 2;
                        iVar38 = (int)lVar25;
                        lVar25 = lVar32;
                      } while (iVar38 + 3 < (int)uVar29);
                      pauVar37 = (undefined1 (*) [16])(*pauVar12 + 8);
                      lVar32 = lVar32 + lVar34;
                      lVar40 = lVar40 + lVar32;
                      lVar36 = lVar36 + lVar32;
                      lVar19 = lVar19 + lVar32;
                      lVar32 = lVar31 + lVar32;
                      iVar38 = (uint)local_168;
                      local_198 = uVar27;
                      local_178 = lVar21;
                      local_160 = uVar23;
                    }
                    if (iVar38 < (int)uVar29) {
                      lVar31 = 0;
                      do {
                        (*pauVar37)[0] = *(undefined1 *)((long)pvVar2 + lVar31 + lVar32);
                        (*pauVar37)[1] = *(undefined1 *)((long)pvVar2 + lVar31 + lVar19);
                        (*pauVar37)[2] = *(undefined1 *)((long)pvVar2 + lVar31 + lVar36);
                        (*pauVar37)[3] = *(undefined1 *)((long)pvVar2 + lVar31 + lVar40);
                        pauVar37 = (undefined1 (*) [16])(*pauVar37 + 4);
                        lVar31 = lVar31 + 1;
                      } while (uVar29 - iVar38 != (int)lVar31);
                    }
                    uVar16 = local_158 + 4;
                    lVar21 = lVar21 + 4;
                    uVar23 = uVar23 + 4;
                    uVar27 = uVar27 + 4;
                    lVar31 = local_190 + 4;
                    this = local_188;
                    local_180 = lVar39;
                  } while ((long)(local_158 + 7) < lVar39);
                }
                if ((int)((uint)uVar16 | 1) < (int)uVar7) {
                  uVar23 = uVar16 & 0xffffffff;
                  do {
                    lVar21 = (long)(this->super_Gemm).B_data.w * (this->super_Gemm).B_data.elemsize;
                    pvVar2 = (this->super_Gemm).B_data.data;
                    puVar13 = (undefined1 *)((long)pvVar2 + (uVar23 + lVar8) * lVar21 + lVar34);
                    puVar15 = (undefined1 *)((long)pvVar2 + (lVar8 + uVar23 + 1) * lVar21 + lVar34);
                    uVar10 = 0;
                    if (1 < (int)uVar29) {
                      iVar38 = 1;
                      do {
                        (*pauVar37)[0] = *puVar13;
                        (*pauVar37)[1] = puVar13[1];
                        (*pauVar37)[2] = *puVar15;
                        (*pauVar37)[3] = puVar15[1];
                        pauVar37 = (undefined1 (*) [16])(*pauVar37 + 4);
                        puVar13 = puVar13 + 2;
                        puVar15 = puVar15 + 2;
                        iVar38 = iVar38 + 2;
                        uVar10 = uVar29 & 0xfffffffe;
                      } while (iVar38 < (int)uVar29);
                    }
                    if ((int)uVar10 < (int)uVar29) {
                      lVar21 = 0;
                      do {
                        (*pauVar37)[0] = puVar13[lVar21];
                        (*pauVar37)[1] = puVar15[lVar21];
                        pauVar37 = (undefined1 (*) [16])(*pauVar37 + 2);
                        lVar21 = lVar21 + 1;
                      } while (uVar29 - uVar10 != (int)lVar21);
                    }
                    uVar16 = uVar23 + 2;
                    lVar21 = uVar23 + 3;
                    uVar23 = uVar16;
                  } while (lVar21 < lVar39);
                }
                local_100 = uVar30;
                local_60 = lVar9;
                if ((int)uVar16 < (int)uVar7) {
                  lVar21 = (long)(int)uVar16;
                  if (lVar9 < (int)uVar30) {
                    uVar30 = TILE_N;
                  }
                  lVar9 = lVar8 + lVar21;
                  do {
                    if (0 < (int)uVar29) {
                      iVar38 = (this->super_Gemm).B_data.w;
                      pvVar2 = (this->super_Gemm).B_data.data;
                      sVar5 = (this->super_Gemm).B_data.elemsize;
                      lVar31 = 0;
                      do {
                        (*pauVar37)[lVar31] =
                             *(undefined1 *)
                              ((long)pvVar2 + lVar31 + sVar5 * lVar9 * (long)iVar38 + lVar34);
                        lVar31 = lVar31 + 1;
                      } while (uVar30 != (uint)lVar31);
                      pauVar37 = (undefined1 (*) [16])(*pauVar37 + lVar31);
                    }
                    lVar21 = lVar21 + 1;
                    lVar9 = lVar9 + 1;
                  } while (lVar21 != lVar39);
                }
              }
              iVar18 = iVar18 + TILE_N;
            } while (iVar18 < (int)uVar28);
          }
          uVar7 = (int)local_118 + 1;
          local_118 = (ulong)uVar7;
          local_58 = (ulong)uVar28;
        } while (uVar7 != local_128);
      }
      if (local_148->lightmode != false) {
        piVar3 = (this->super_Gemm).B_data.refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar2 = (this->super_Gemm).B_data.data;
            pAVar4 = (this->super_Gemm).B_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).B_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).B_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).B_data.data = (void *)0x0;
        (this->super_Gemm).B_data.refcount = (int *)0x0;
        (this->super_Gemm).B_data.dims = 0;
        (this->super_Gemm).B_data.w = 0;
        (this->super_Gemm).B_data.h = 0;
        (this->super_Gemm).B_data.d = 0;
        (this->super_Gemm).B_data.c = 0;
      }
      if (bVar41) {
        return -100;
      }
    }
    if (((this->super_Gemm).constantC != 0) && ((this->super_Gemm).constant_broadcast_type_C != -1))
    {
      piVar3 = (this->super_Gemm).C_data.refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->CT_data).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar2 = (this->CT_data).data;
          pAVar4 = (this->CT_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar2 != (void *)0x0) {
              free(pvVar2);
            }
          }
          else {
            (*pAVar4->_vptr_Allocator[3])();
          }
        }
      }
      (this->CT_data).cstep = 0;
      *(undefined1 (*) [16])((long)&(this->CT_data).refcount + 4) = (undefined1  [16])0x0;
      (this->CT_data).data = (void *)0x0;
      (this->CT_data).refcount = (int *)0x0;
      piVar3 = (this->super_Gemm).C_data.refcount;
      (this->CT_data).data = (this->super_Gemm).C_data.data;
      (this->CT_data).refcount = piVar3;
      (this->CT_data).elemsize = (this->super_Gemm).C_data.elemsize;
      (this->CT_data).elempack = (this->super_Gemm).C_data.elempack;
      (this->CT_data).allocator = (this->super_Gemm).C_data.allocator;
      iVar18 = (this->super_Gemm).C_data.w;
      iVar38 = (this->super_Gemm).C_data.h;
      iVar20 = (this->super_Gemm).C_data.d;
      (this->CT_data).dims = (this->super_Gemm).C_data.dims;
      (this->CT_data).w = iVar18;
      (this->CT_data).h = iVar38;
      (this->CT_data).d = iVar20;
      (this->CT_data).c = (this->super_Gemm).C_data.c;
      (this->CT_data).cstep = (this->super_Gemm).C_data.cstep;
      if (local_148->lightmode == true) {
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar2 = (this->super_Gemm).C_data.data;
            pAVar4 = (this->super_Gemm).C_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).C_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).C_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).C_data.data = (void *)0x0;
        (this->super_Gemm).C_data.refcount = (int *)0x0;
        (this->super_Gemm).C_data.dims = 0;
        (this->super_Gemm).C_data.w = 0;
        (this->super_Gemm).C_data.h = 0;
        (this->super_Gemm).C_data.d = 0;
        (this->super_Gemm).C_data.c = 0;
      }
    }
    if ((((this->super_Gemm).constantA != 0) || ((this->super_Gemm).constantB != 0)) ||
       (iVar18 = 0, (this->super_Gemm).constantC != 0)) {
      *(int *)&(this->super_Gemm).field_0x244 = local_148->num_threads;
      iVar18 = 0;
    }
  }
  else {
    uVar7 = (this->super_Gemm).constantM;
    uVar28 = (this->super_Gemm).constantK;
    local_170 = (ulong)uVar28;
    get_optimal_tile_mnk_int8
              (uVar7,0,uVar28,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar38 = TILE_K;
    iVar18 = TILE_M;
    local_138 = CONCAT44(local_138._4_4_,(int)(uVar7 + TILE_M + -1) / TILE_M);
    iVar20 = iVar38;
    local_108 = (ulong)uVar7;
    if (3 < TILE_K) {
      iVar6 = cpu_support_x86_avx512_vnni();
      bVar41 = true;
      if (iVar6 == 0) {
        iVar6 = cpu_support_x86_avx_vnni();
        bVar41 = iVar6 != 0;
      }
      iVar6 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar41 ^ 1) && iVar6 == 0) {
        iVar20 = 0x40;
        if (((iVar18 < 0x10) && (iVar20 = 0x20, iVar18 < 8)) && (iVar20 = 0x10, iVar18 < 4)) {
          iVar20 = (uint)(1 < iVar18) * 4 + 4;
        }
        iVar20 = iVar20 + iVar38;
      }
    }
    uVar16 = local_170;
    Mat::create(&this->AT_data,iVar20 * iVar18,((int)local_170 + iVar38 + -1) / iVar38,
                (uint)local_138,1,(Allocator *)0x0);
    if ((this->AT_data).data == (void *)0x0) {
      bVar41 = true;
    }
    else {
      bVar41 = (long)(this->AT_data).c * (this->AT_data).cstep == 0;
    }
    if (!bVar41) {
      local_110 = local_110 & 0xffffffffffffff00;
      if (0 < (int)(uint)local_138) {
        local_120 = &(this->super_Gemm).A_data;
        local_130 = 0;
        do {
          if (0 < (int)uVar16) {
            iVar38 = TILE_M * (int)local_130;
            local_168 = CONCAT44(local_168._4_4_,(int)local_108 - iVar38);
            lVar8 = (long)iVar38;
            iVar18 = 0;
            local_140 = CONCAT44(local_140._4_4_,iVar38);
            do {
              uVar7 = (uint)local_168;
              if (TILE_M < (int)(uint)local_168) {
                uVar7 = TILE_M;
              }
              uVar28 = (int)uVar16 - iVar18;
              if (TILE_K < (int)uVar28) {
                uVar28 = TILE_K;
              }
              local_c8 = (this->AT_data).elemsize;
              local_b0._4_4_ = (this->AT_data).w;
              local_98 = (size_t)(int)local_b0._4_4_;
              local_c0 = (this->AT_data).elempack;
              local_b8 = (this->AT_data).allocator;
              _TILE_M_1 = (undefined1 *)
                          ((long)(this->AT_data).data +
                          local_c8 * local_98 * (long)(iVar18 / TILE_K) +
                          (long)(iVar38 / TILE_M) * (this->AT_data).cstep * local_c8);
              uStack_d0 = 0;
              uStack_cc = 0;
              local_b0._0_4_ = 2;
              local_b0._8_8_ = 0x100000001;
              local_a0 = 1;
              local_198 = CONCAT44(local_198._4_4_,iVar18);
              if ((this->super_Gemm).transA == 0) {
                pack_A_tile_int8(local_120,(Mat *)&TILE_M_1,iVar38,uVar7,iVar18,uVar28);
              }
              else {
                iVar20 = (this->super_Gemm).A_data.w;
                lVar9 = (long)iVar20;
                uVar23 = 0;
                local_180 = CONCAT44(local_180._4_4_,uVar7);
                puVar13 = _TILE_M_1;
                if (3 < (int)uVar7) {
                  local_178 = (long)iVar18;
                  lVar32 = (long)(iVar20 * 2);
                  local_160 = CONCAT44(local_160._4_4_,uVar28) & 0xfffffffffffffffe;
                  lVar21 = (iVar20 + 3) + lVar8;
                  uVar35 = (iVar20 + 2) + lVar8;
                  lVar31 = (iVar20 + 1) + lVar8;
                  lVar34 = lVar8 + lVar9;
                  uVar27 = 0;
                  lVar39 = lVar8;
                  do {
                    pvVar2 = (this->super_Gemm).A_data.data;
                    lVar19 = (this->super_Gemm).A_data.w * local_178 *
                             (this->super_Gemm).A_data.elemsize;
                    if ((int)uVar28 < 2) {
                      lVar36 = (long)pvVar2 + lVar8 + uVar27;
                      uVar29 = 0;
                    }
                    else {
                      lVar36 = (long)pvVar2 + lVar39;
                      lVar22 = lVar21 + (long)pvVar2;
                      lVar40 = (long)pvVar2 + uVar35;
                      lVar26 = (long)pvVar2 + lVar31;
                      lVar14 = (long)pvVar2 + lVar34;
                      iVar38 = 1;
                      do {
                        *puVar13 = *(undefined1 *)(lVar36 + lVar19);
                        puVar13[1] = *(undefined1 *)(lVar14 + lVar19);
                        puVar13[2] = *(undefined1 *)(lVar36 + 1 + lVar19);
                        puVar13[3] = *(undefined1 *)(lVar26 + lVar19);
                        puVar13[4] = *(undefined1 *)(lVar36 + 2 + lVar19);
                        puVar13[5] = *(undefined1 *)(lVar40 + lVar19);
                        puVar13[6] = *(undefined1 *)(lVar36 + 3 + lVar19);
                        puVar13[7] = *(undefined1 *)(lVar22 + lVar19);
                        puVar13 = puVar13 + 8;
                        iVar38 = iVar38 + 2;
                        lVar36 = lVar36 + lVar32;
                        lVar22 = lVar22 + lVar32;
                        lVar40 = lVar40 + lVar32;
                        lVar26 = lVar26 + lVar32;
                        lVar14 = lVar14 + lVar32;
                      } while (iVar38 < (int)uVar28);
                      uVar29 = uVar28 & 0xfffffffe;
                      this = local_188;
                      local_190 = lVar31;
                      local_158 = uVar35;
                    }
                    iVar38 = uVar28 - uVar29;
                    if (iVar38 != 0 && (int)uVar29 <= (int)uVar28) {
                      puVar15 = (undefined1 *)(lVar36 + lVar19 + 3);
                      do {
                        *puVar13 = puVar15[-3];
                        puVar13[1] = puVar15[-2];
                        puVar13[2] = puVar15[-1];
                        puVar13[3] = *puVar15;
                        puVar13 = puVar13 + 4;
                        puVar15 = puVar15 + lVar9;
                        iVar38 = iVar38 + -1;
                      } while (iVar38 != 0);
                    }
                    uVar23 = uVar27 + 4;
                    uVar11 = uVar27 + 7;
                    lVar39 = lVar39 + 4;
                    lVar21 = lVar21 + 4;
                    uVar35 = uVar35 + 4;
                    lVar31 = lVar31 + 4;
                    lVar34 = lVar34 + 4;
                    uVar27 = uVar23;
                    uVar16 = local_170;
                    iVar38 = (int)local_140;
                  } while (uVar11 < uVar7);
                }
                if ((int)((uint)uVar23 | 1) < (int)uVar7) {
                  lVar31 = (long)(iVar20 * 2);
                  lVar34 = lVar8 + (uVar23 & 0xffffffff);
                  lVar21 = (iVar20 + 1) + lVar34;
                  lVar39 = lVar34 + lVar9;
                  uVar27 = uVar23 & 0xffffffff;
                  do {
                    pvVar2 = (local_188->super_Gemm).A_data.data;
                    lVar32 = (long)(local_188->super_Gemm).A_data.w * (long)iVar18 *
                             (local_188->super_Gemm).A_data.elemsize;
                    if ((int)uVar28 < 2) {
                      lVar19 = (long)pvVar2 + lVar8 + uVar27;
                      uVar29 = 0;
                    }
                    else {
                      lVar19 = (long)pvVar2 + lVar34;
                      lVar36 = (long)pvVar2 + lVar21;
                      lVar40 = (long)pvVar2 + lVar39;
                      iVar38 = 1;
                      do {
                        *puVar13 = *(undefined1 *)(lVar19 + lVar32);
                        puVar13[1] = *(undefined1 *)(lVar40 + lVar32);
                        puVar13[2] = *(undefined1 *)(lVar19 + 1 + lVar32);
                        puVar13[3] = *(undefined1 *)(lVar36 + lVar32);
                        puVar13 = puVar13 + 4;
                        iVar38 = iVar38 + 2;
                        lVar19 = lVar19 + lVar31;
                        lVar36 = lVar36 + lVar31;
                        lVar40 = lVar40 + lVar31;
                        uVar29 = uVar28 & 0xfffffffe;
                      } while (iVar38 < (int)uVar28);
                    }
                    iVar38 = uVar28 - uVar29;
                    if (iVar38 != 0 && (int)uVar29 <= (int)uVar28) {
                      puVar15 = (undefined1 *)(lVar19 + lVar32 + 1);
                      do {
                        *puVar13 = puVar15[-1];
                        puVar13[1] = *puVar15;
                        puVar13 = puVar13 + 2;
                        puVar15 = puVar15 + lVar9;
                        iVar38 = iVar38 + -1;
                      } while (iVar38 != 0);
                    }
                    uVar23 = uVar27 + 2;
                    lVar32 = uVar27 + 3;
                    lVar34 = lVar34 + 2;
                    lVar21 = lVar21 + 2;
                    lVar39 = lVar39 + 2;
                    uVar16 = local_170;
                    uVar27 = uVar23;
                    this = local_188;
                    iVar38 = (int)local_140;
                  } while (lVar32 < (int)uVar7);
                }
                if ((int)uVar23 < (int)uVar7) {
                  uVar23 = uVar23 & 0xffffffff;
                  do {
                    if (0 < (int)uVar28) {
                      puVar15 = (undefined1 *)
                                ((long)(this->super_Gemm).A_data.data +
                                lVar8 + uVar23 +
                                (long)(this->super_Gemm).A_data.w * (long)iVar18 *
                                (this->super_Gemm).A_data.elemsize);
                      uVar29 = uVar28;
                      do {
                        *puVar13 = *puVar15;
                        puVar13 = puVar13 + 1;
                        puVar15 = puVar15 + lVar9;
                        uVar29 = uVar29 - 1;
                      } while (uVar29 != 0);
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar23 != uVar7);
                }
              }
              piVar3 = (int *)CONCAT44(uStack_cc,uStack_d0);
              iVar18 = (int)local_198;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (local_b8 == (Allocator *)0x0) {
                    if (_TILE_M_1 != (undefined1 *)0x0) {
                      free(_TILE_M_1);
                    }
                  }
                  else {
                    (*local_b8->_vptr_Allocator[3])();
                  }
                }
              }
              local_98 = 0;
              _TILE_M_1 = (undefined1 *)0x0;
              uStack_d0 = 0;
              uStack_cc = 0;
              local_c8 = 0;
              local_c0 = 0;
              local_b0 = (undefined1  [16])0x0;
              local_a0 = 0;
              iVar18 = iVar18 + TILE_K;
            } while (iVar18 < (int)uVar16);
          }
          uVar7 = (int)local_130 + 1;
          local_130 = (ulong)uVar7;
        } while (uVar7 != (uint)local_138);
      }
      if (local_148->lightmode != false) {
        piVar3 = (this->super_Gemm).A_data.refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar2 = (this->super_Gemm).A_data.data;
            pAVar4 = (this->super_Gemm).A_data.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).A_data.cstep = 0;
        *(undefined1 (*) [16])((long)&(this->super_Gemm).A_data.refcount + 4) =
             (undefined1  [16])0x0;
        (this->super_Gemm).A_data.data = (void *)0x0;
        (this->super_Gemm).A_data.refcount = (int *)0x0;
        (this->super_Gemm).A_data.dims = 0;
        (this->super_Gemm).A_data.w = 0;
        (this->super_Gemm).A_data.h = 0;
        (this->super_Gemm).A_data.d = 0;
        (this->super_Gemm).A_data.c = 0;
      }
      if ((char)local_110 != '\0') {
        return -100;
      }
      goto LAB_004b74b1;
    }
LAB_004b7584:
    iVar18 = -100;
  }
  return iVar18;
}

Assistant:

int Gemm_x86::create_pipeline_int8(const Option& opt)
{
    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
        bool has_w_shift = false;
        if (TILE_K >= 4)
        {
            has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
            if (ncnn::cpu_support_x86_avx_vnni_int8())
                has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
        }
        if (has_w_shift)
        {
            int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
            AT_data.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
        {
            AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 1u, (Allocator*)0);
        }
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk_int8(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_N; ppj++)
        {
            const int j = ppj * TILE_N;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_jj = std::min((N - j), TILE_N);
                const int max_kk = std::min((K - k), TILE_K);

                Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (transB)
                {
                    pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
                else
                {
                    transpose_pack_B_tile_int8(B_data, BT_tile, j, max_jj, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}